

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_NetworkIdentifyUnset_Test::TestBody
          (InterpreterTestSuite_PC_NetworkIdentifyUnset_Test *this)

{
  Registry *pRVar1;
  string *this_00;
  char *expected_predicate_value;
  char *pcVar2;
  Status local_4a2;
  allocator local_4a1;
  allocator local_4a0;
  allocator local_49f;
  allocator local_49e;
  allocator local_49d;
  allocator local_49c;
  allocator local_49b;
  allocator local_49a;
  Status local_499;
  AssertionResult gtest_ar_1;
  Expression expr;
  Value local_468;
  Value value;
  State local_3d0;
  State local_3cc;
  string local_3c8;
  AssertionResult gtest_ar_;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_388;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_368;
  string local_348;
  UnixTime local_328;
  UnixTime local_320;
  string local_318;
  string local_2f8;
  Network nwk;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  value.mError.mCode = kNone;
  value.mError._4_4_ = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&nwk,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&value);
  if ((char)nwk.mId.mId == '\0') {
    testing::Message::Message((Message *)&value);
    if (nwk.mName._M_dataplus._M_p == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)nwk.mName._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_468,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x672,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&value);
    this_00 = &nwk.mName;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nwk.mName);
    pRVar1 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&value,"127.0.0.1",&local_49a);
    local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_468,"1.1",&local_49b);
    ot::commissioner::BorderAgent::State::State(&local_3cc,0,0,0,0,0);
    std::__cxx11::string::string((string *)&expr,"net1",&local_49c);
    std::__cxx11::string::string((string *)&gtest_ar_,"",&local_49d);
    std::__cxx11::string::string((string *)&local_3c8,"",&local_49e);
    std::__cxx11::string::string((string *)&local_348,"",&local_49f);
    local_388._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_2f8,"domain1",&local_4a0);
    pcVar2 = "";
    std::__cxx11::string::string((string *)&local_318,"",&local_4a1);
    ot::commissioner::UnixTime::UnixTime(&local_320,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&nwk,(string *)&value,0x4e21,(ByteArray *)&local_368,
               (string *)&local_468,local_3cc,(string *)&expr,1,(string *)&gtest_ar_,&local_3c8,
               (Timestamp)0x0,0,&local_348,(ByteArray *)&local_388,&local_2f8,'\0',0,&local_318,
               local_320,0x103f);
    local_499 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&nwk);
    local_4a2 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_499,&local_4a2);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&nwk);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_388);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)&local_468);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_368);
    std::__cxx11::string::~string((string *)&value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&nwk);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x676,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
      this_00 = (string *)&gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if ((long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      pRVar1 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&value,"127.0.0.2",&local_49a);
      local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_468,"1.1",&local_49b);
      ot::commissioner::BorderAgent::State::State(&local_3d0,0,0,0,0,0);
      std::__cxx11::string::string((string *)&expr,"net2",&local_49c);
      std::__cxx11::string::string((string *)&gtest_ar_,"",&local_49d);
      std::__cxx11::string::string((string *)&local_3c8,"",&local_49e);
      std::__cxx11::string::string((string *)&local_348,"",&local_49f);
      local_388._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_2f8,"",&local_4a0);
      pcVar2 = "";
      std::__cxx11::string::string((string *)&local_318,"",&local_4a1);
      ot::commissioner::UnixTime::UnixTime(&local_328,0);
      expected_predicate_value = (char *)(ulong)(uint)local_3d0;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&nwk,(string *)&value,0x4e22,(ByteArray *)&local_368,
                 (string *)&local_468,local_3d0,(string *)&expr,2,(string *)&gtest_ar_,&local_3c8,
                 (Timestamp)0x0,0,&local_348,(ByteArray *)&local_388,&local_2f8,'\0',0,&local_318,
                 local_328,0x3f);
      local_499 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&nwk);
      local_4a2 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x3F})"
                 ,"RegistryStatus::kSuccess",&local_499,&local_4a2);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&nwk);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_388);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&expr);
      std::__cxx11::string::~string((string *)&local_468);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_368);
      std::__cxx11::string::~string((string *)&value);
      if (gtest_ar_1.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        ot::commissioner::persistent_storage::Network::Network(&nwk);
        local_468.mError.mCode._0_1_ =
             ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(ctx.mRegistry,&nwk);
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)expr.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&value,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                   "RegistryStatus::kSuccess",(Status *)&local_468,(Status *)&expr);
        if ((undefined1)value.mError.mCode == kNone) {
          testing::Message::Message((Message *)&local_468);
          if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)value.mError.mMessage._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&expr,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x67d,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&local_468);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
          if ((long *)CONCAT71(local_468.mError._1_7_,(undefined1)local_468.mError.mCode) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_468.mError._1_7_,(undefined1)local_468.mError.mCode
                                          ) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&value.mError.mMessage);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&value,"nwk.mId.mId","EMPTY_ID",(uint *)&nwk,
                   &ot::commissioner::persistent_storage::EMPTY_ID);
        if ((undefined1)value.mError.mCode == kNone) {
          testing::Message::Message((Message *)&local_468);
          if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)value.mError.mMessage._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&expr,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x67e,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&local_468);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
          if ((long *)CONCAT71(local_468.mError._1_7_,(undefined1)local_468.mError.mCode) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_468.mError._1_7_,(undefined1)local_468.mError.mCode
                                          ) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&value.mError.mMessage);
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
        value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string
                  ((string *)&local_468,"Network identify",(allocator *)&local_3c8);
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&local_468);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&expr,&gtest_ar_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
        std::__cxx11::string::~string((string *)&local_468);
        ot::commissioner::Interpreter::Eval(&local_468,&ctx.mInterpreter,&expr);
        ot::commissioner::Interpreter::Value::operator=(&value,&local_468);
        ot::commissioner::Interpreter::Value::~Value(&local_468);
        gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_3c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_468,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false"
                     ,"true",expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_348,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x685,(char *)CONCAT71(local_468.mError._1_7_,
                                             (undefined1)local_468.mError.mCode));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_348,(Message *)&local_3c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
          std::__cxx11::string::~string((string *)&local_468);
          if ((long *)local_3c8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_3c8._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ot::commissioner::Interpreter::Value::ToString_abi_cxx11_((string *)&local_468,&value);
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar_,"\"none\"","value.ToString().c_str()","none",
                   (char *)CONCAT71(local_468.mError._1_7_,(undefined1)local_468.mError.mCode));
        std::__cxx11::string::~string((string *)&local_468);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_468);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_3c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x686,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_3c8,(Message *)&local_468);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
          if ((long *)CONCAT71(local_468.mError._1_7_,(undefined1)local_468.mError.mCode) !=
              (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_468.mError._1_7_,(undefined1)local_468.mError.mCode
                                          ) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ot::commissioner::Interpreter::Value::~Value(&value);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&expr);
        ot::commissioner::persistent_storage::Network::~Network(&nwk);
        goto LAB_0016446d;
      }
      testing::Message::Message((Message *)&nwk);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x67a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
      this_00 = (string *)&gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if ((long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(nwk._1_7_,(char)nwk.mId.mId) + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
LAB_0016446d:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkIdentifyUnset)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0,
                                             0x3F}),
              RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, EMPTY_ID);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network identify");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    EXPECT_STREQ("none", value.ToString().c_str());
}